

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int file_write(sptr_t data,char *path,char *mode)

{
  FILE *__s;
  size_t sVar1;
  ulong __n;
  size_t bytes;
  FILE *f;
  int result;
  char *mode_local;
  char *path_local;
  sptr_t data_local;
  
  __n = data.size;
  if (((data.ptr == (uchar *)0x0) || (path == (char *)0x0)) || (mode == (char *)0x0)) {
    data_local.size._4_4_ = 0;
  }
  else {
    __s = fopen(path,mode);
    if (__s == (FILE *)0x0) {
      perror("Unable to open file for writing\n");
      fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
      data_local.size._4_4_ = 0;
    }
    else {
      sVar1 = fwrite(data.ptr,1,__n,__s);
      if (__n > sVar1) {
        fprintf(_stderr,"Unable to write all bytes to a file\n");
        fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
      }
      f._4_4_ = (uint)(__n <= sVar1);
      fclose(__s);
      data_local.size._4_4_ = f._4_4_;
    }
  }
  return data_local.size._4_4_;
}

Assistant:

int file_write(sptr_t data, const char *path, const char *mode)
{
	int result = 0;
	if (SPTR_IS_NULL(data) || path == NULL || mode == NULL) {
		return result;
	}
	FILE *f = fopen(path, mode);
	if (!f) {
		perror("Unable to open file for writing\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		return result;
	}
	size_t bytes = fwrite(data.ptr, 1, data.size, f);
	if (bytes < data.size) {
		fprintf(stderr, "Unable to write all bytes to a file\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		goto end;
	}
	result = 1;
end:
	fclose(f);
	return result;
}